

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int get_data_cache_size(int cpuid,int level)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  FILE *pFVar7;
  size_t sVar8;
  long lVar9;
  size_t __cpu;
  ulong uVar10;
  int i;
  long lVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  ulong uVar18;
  int cache_size_K;
  int thread_siblings;
  CpuSet shared_cpu_map;
  int cache_level;
  char path [256];
  int local_2c0;
  int local_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  int *local_228;
  char local_138 [264];
  
  uVar10 = 0;
  do {
    sprintf(local_138,"/sys/devices/system/cpu/cpu%d/cache/index%d/level",cpuid,uVar10);
    pFVar7 = fopen(local_138,"rb");
    if (pFVar7 == (FILE *)0x0) {
      iVar5 = 2;
    }
    else {
      local_238._0_4_ = 0xffffffff;
      iVar5 = __isoc99_fscanf(pFVar7,"%d",local_238);
      fclose(pFVar7);
      iVar5 = (uint)(local_238._0_4_ != level || iVar5 != 1) << 2;
    }
    if (iVar5 != 4) {
      if (iVar5 != 0) {
        uVar12 = 0xffffffff;
        goto LAB_005eafba;
      }
      sprintf(local_138,"/sys/devices/system/cpu/cpu%d/cache/index%d/type",cpuid,uVar10);
      pFVar7 = fopen(local_138,"rb");
      if (pFVar7 == (FILE *)0x0) {
        iVar5 = 2;
      }
      else {
        iVar6 = __isoc99_fscanf(pFVar7,"%31s",local_238);
        fclose(pFVar7);
        iVar5 = 4;
        if (iVar6 == 1) {
          bVar3 = local_238[4] != '\0';
          bVar4 = local_238._0_4_ != 0x61746144;
          iVar5 = (uint)(local_238._0_8_ != 0x64656966696e55 && (bVar3 || bVar4)) << 2;
        }
      }
      if (iVar5 != 4) {
        uVar12 = 0xffffffff;
        if (iVar5 == 0) {
          uVar12 = (uint)uVar10;
        }
LAB_005eafba:
        if (uVar12 == 0xffffffff) {
          iVar5 = 0;
        }
        else {
          local_2c0 = 0;
          iVar5 = 0;
          sprintf(local_138,"/sys/devices/system/cpu/cpu%d/cache/index%d/size",cpuid,(ulong)uVar12);
          pFVar7 = fopen(local_138,"rb");
          if (pFVar7 != (FILE *)0x0) {
            iVar5 = 0;
            iVar6 = __isoc99_fscanf(pFVar7,"%dK",&local_2c0);
            fclose(pFVar7);
            if (iVar6 == 1) {
              local_248 = (undefined1  [16])0x0;
              local_258 = (undefined1  [16])0x0;
              local_268 = (undefined1  [16])0x0;
              local_278 = (undefined1  [16])0x0;
              local_288 = (undefined1  [16])0x0;
              local_298 = (undefined1  [16])0x0;
              local_2a8 = (undefined1  [16])0x0;
              local_2b8 = (undefined1  [16])0x0;
              iVar5 = 0;
              sprintf(local_138,"/sys/devices/system/cpu/cpu%d/cache/index%d/shared_cpu_map",cpuid,
                      (ulong)uVar12);
              pFVar7 = fopen(local_138,"rb");
              if (pFVar7 != (FILE *)0x0) {
                iVar6 = __isoc99_fscanf(pFVar7,"%255s",local_238);
                fclose(pFVar7);
                if (iVar6 == 1) {
                  sVar8 = strlen(local_238);
                  uVar12 = (uint)sVar8 - 2;
                  if (local_238[1] != 'x' || local_238[0] != (vector<int,std::allocator<int>>)0x30)
                  {
                    uVar12 = (uint)sVar8;
                  }
                  if (0 < (int)uVar12) {
                    lVar9 = (ulong)uVar12 + 1;
                    uVar10 = 0;
                    do {
                      bVar1 = local_248[lVar9 + 0xe];
                      bVar2 = (byte)uVar10;
                      if ((uVar10 < 0x400 & bVar1) == 1) {
                        *(ulong *)(local_2b8 + (uVar10 >> 6) * 8) =
                             *(ulong *)(local_2b8 + (uVar10 >> 6) * 8) | 1L << (bVar2 & 0x3c);
                      }
                      if ((uVar10 < 0x400 & bVar1 >> 1) == 1) {
                        *(ulong *)(local_2b8 + (uVar10 >> 6) * 8) =
                             *(ulong *)(local_2b8 + (uVar10 >> 6) * 8) | 2L << (bVar2 & 0x3c);
                      }
                      if ((uVar10 < 0x400 & bVar1 >> 2) == 1) {
                        *(ulong *)(local_2b8 + (uVar10 >> 6) * 8) =
                             *(ulong *)(local_2b8 + (uVar10 >> 6) * 8) | 4L << (bVar2 & 0x3c);
                      }
                      if ((uVar10 < 0x400 & bVar1 >> 3) == 1) {
                        *(ulong *)(local_2b8 + (uVar10 >> 6) * 8) =
                             *(ulong *)(local_2b8 + (uVar10 >> 6) * 8) | 8L << (bVar2 & 0x3c);
                      }
                      uVar10 = uVar10 + 4;
                      lVar9 = lVar9 + -1;
                    } while (1 < lVar9);
                  }
                }
                else {
                  get_data_cache_size();
                }
                iVar5 = 0;
                if (iVar6 == 1) {
                  uVar10 = 0;
                  iVar5 = 0;
                  iVar6 = 0;
                  auVar13 = _DAT_005ee5d0;
                  do {
                    uVar17 = *(ulong *)(local_2b8 + (uVar10 >> 6) * 8);
                    auVar15 = auVar13 & _DAT_00601310;
                    auVar16._8_4_ = auVar15._8_4_;
                    auVar16._12_4_ = auVar15._12_4_;
                    auVar16._0_8_ = auVar15._8_8_;
                    auVar14._8_4_ = (int)uVar17;
                    auVar14._0_8_ = uVar17;
                    auVar14._12_4_ = (int)(uVar17 >> 0x20);
                    uVar17 = 1L << auVar15._0_8_ & uVar17;
                    uVar18 = 1L << auVar16._8_8_ & auVar14._8_8_;
                    iVar5 = (iVar5 - (uint)((int)uVar17 == 0 && (int)(uVar17 >> 0x20) == 0)) + 1;
                    iVar6 = (iVar6 - (uint)((int)uVar18 == 0 && (int)(uVar18 >> 0x20) == 0)) + 1;
                    uVar10 = uVar10 + 2;
                    lVar9 = auVar13._8_8_;
                    auVar13._0_8_ = auVar13._0_8_ + 2;
                    auVar13._8_8_ = lVar9 + 2;
                  } while (uVar10 != 0x400);
                  if (iVar6 + iVar5 == 1) {
                    iVar5 = local_2c0 << 10;
                  }
                  else {
                    local_238 = (undefined1  [16])0x0;
                    local_228 = (int *)0x0;
                    if (g_cpucount < 1) {
                      iVar5 = 0;
                    }
                    else {
                      uVar10 = 0;
                      iVar5 = 0;
                      do {
                        if (((uVar10 < 0x400) &&
                            ((*(ulong *)(local_2b8 + (uVar10 >> 6) * 8) >> (uVar10 & 0x3f) & 1) != 0
                            )) && (local_2bc = get_thread_siblings((int)uVar10), local_2bc != -1)) {
                          if (local_238._8_8_ - local_238._0_8_ != 0) {
                            lVar9 = (long)(local_238._8_8_ - local_238._0_8_) >> 2;
                            lVar11 = 0;
                            do {
                              if (*(int *)(local_238._0_8_ + lVar11 * 4) == local_2bc)
                              goto LAB_005eb373;
                              lVar11 = lVar11 + 1;
                            } while (lVar9 + (ulong)(lVar9 == 0) != lVar11);
                          }
                          if ((int *)local_238._8_8_ == local_228) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)local_238,
                                       (iterator)local_238._8_8_,&local_2bc);
                          }
                          else {
                            *(int *)local_238._8_8_ = local_2bc;
                            local_238._8_8_ = (int *)(local_238._8_8_ + 4);
                          }
                          iVar5 = iVar5 + 1;
                        }
LAB_005eb373:
                        uVar10 = uVar10 + 1;
                      } while ((long)uVar10 < (long)g_cpucount);
                    }
                    if ((void *)local_238._0_8_ != (void *)0x0) {
                      operator_delete((void *)local_238._0_8_,(long)local_228 - local_238._0_8_);
                    }
                    iVar6 = local_2c0 / iVar5 + 3;
                    iVar5 = local_2c0 / iVar5 + 6;
                    if (-1 < iVar6) {
                      iVar5 = iVar6;
                    }
                    iVar5 = (iVar5 >> 2) << 0xc;
                  }
                }
              }
            }
            else {
              get_data_cache_size();
            }
          }
        }
        return iVar5;
      }
    }
    uVar10 = (ulong)((uint)uVar10 + 1);
  } while( true );
}

Assistant:

static int get_data_cache_size(int cpuid, int level)
{
    char path[256];

    // discover sysfs cache entry
    int indexid = -1;
    for (int i = 0;; i++)
    {
        // check level
        {
            sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/level", cpuid, i);
            FILE* fp = fopen(path, "rb");
            if (!fp)
                break;

            int cache_level = -1;
            int nscan = fscanf(fp, "%d", &cache_level);
            fclose(fp);
            if (nscan != 1 || cache_level != level)
                continue;
        }

        // check type
        {
            sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/type", cpuid, i);
            FILE* fp = fopen(path, "rb");
            if (!fp)
                break;

            char type[32];
            int nscan = fscanf(fp, "%31s", type);
            fclose(fp);
            if (nscan != 1 || (strcmp(type, "Data") != 0 && strcmp(type, "Unified") != 0))
                continue;
        }

        indexid = i;
        break;
    }

    if (indexid == -1)
    {
        // no sysfs entry
        return 0;
    }

    // get size
    int cache_size_K = 0;
    {
        sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/size", cpuid, indexid);
        FILE* fp = fopen(path, "rb");
        if (!fp)
            return 0;

        int nscan = fscanf(fp, "%dK", &cache_size_K);
        fclose(fp);
        if (nscan != 1)
        {
            NCNN_LOGE("fscanf cache_size_K error %d", nscan);
            return 0;
        }
    }

    // parse shared_cpu_map mask
    ncnn::CpuSet shared_cpu_map;
    {
        sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/shared_cpu_map", cpuid, indexid);
        FILE* fp = fopen(path, "rb");
        if (!fp)
            return 0;

        char shared_cpu_map_str[256];
        int nscan = fscanf(fp, "%255s", shared_cpu_map_str);
        fclose(fp);
        if (nscan != 1)
        {
            NCNN_LOGE("fscanf shared_cpu_map error %d", nscan);
            return 0;
        }

        int len = strlen(shared_cpu_map_str);

        if (shared_cpu_map_str[0] == '0' && shared_cpu_map_str[1] == 'x')
        {
            // skip leading 0x
            len -= 2;
        }

        int ci = 0;
        for (int i = len - 1; i >= 0; i--)
        {
            char x = shared_cpu_map_str[i];
            if (x & 1) shared_cpu_map.enable(ci + 0);
            if (x & 2) shared_cpu_map.enable(ci + 1);
            if (x & 4) shared_cpu_map.enable(ci + 2);
            if (x & 8) shared_cpu_map.enable(ci + 3);

            ci += 4;
        }
    }

    if (shared_cpu_map.num_enabled() == 1)
        return cache_size_K * 1024;

    // resolve physical cpu count in the shared_cpu_map
    int shared_physical_cpu_count = 0;
    {
        std::vector<int> thread_set;
        for (int i = 0; i < g_cpucount; i++)
        {
            if (!shared_cpu_map.is_enabled(i))
                continue;

            int thread_siblings = get_thread_siblings(i);
            if (thread_siblings == -1)
            {
                // ignore malformed one
                continue;
            }

            bool thread_siblings_exists = false;
            for (size_t j = 0; j < thread_set.size(); j++)
            {
                if (thread_set[j] == thread_siblings)
                {
                    thread_siblings_exists = true;
                    break;
                }
            }

            if (!thread_siblings_exists)
            {
                thread_set.push_back(thread_siblings);
                shared_physical_cpu_count++;
            }
        }
    }

    // return per-physical-core cache size with 4K aligned
    cache_size_K = (cache_size_K / shared_physical_cpu_count + 3) / 4 * 4;

    return cache_size_K * 1024;
}